

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O3

void __thiscall BSA_SpikeDecodingSynapse::update(BSA_SpikeDecodingSynapse *this)

{
  BSA_SpikeDecodingSynapse_param *pBVar1;
  pointer pdVar2;
  _Elt_pointer pdVar3;
  _Map_pointer ppdVar4;
  Population *pPVar5;
  double in_RAX;
  pointer pdVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  double local_28;
  
  if (0 < this->inputSize) {
    lVar13 = 0;
    local_28 = in_RAX;
    do {
      std::deque<double,_std::allocator<double>_>::pop_front
                ((this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar13);
      local_28 = 0.0;
      std::deque<double,_std::allocator<double>_>::emplace_back<double>
                ((this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar13,&local_28);
      if ((((this->super_Synapse).from_population)->output).
          super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13]->type == Spike) {
        pBVar1 = this->param;
        pdVar6 = (this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (0.0 < pBVar1->filter_length) {
          pdVar2 = (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
          lVar8 = (long)pdVar3 -
                  (long)pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first;
          ppdVar4 = pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node;
          lVar10 = lVar8 >> 3;
          lVar11 = 0;
          do {
            uVar7 = lVar10 + lVar11;
            if ((long)uVar7 < 0) {
              uVar7 = (long)uVar7 >> 6;
LAB_0011aff9:
              pdVar12 = (double *)((long)ppdVar4[uVar7] + lVar8 + uVar7 * -0x200);
            }
            else {
              if (0x3f < uVar7) {
                uVar7 = uVar7 >> 6;
                goto LAB_0011aff9;
              }
              pdVar12 = pdVar3 + lVar11;
            }
            *pdVar12 = pdVar2[lVar11] + *pdVar12;
            lVar11 = lVar11 + 1;
            lVar8 = lVar8 + 8;
          } while ((double)(int)lVar11 < pBVar1->filter_length);
        }
      }
      else {
        pdVar6 = (this->input).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      pdVar12 = pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      lVar8 = (long)pdVar12 -
              (long)pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first;
      uVar7 = lVar8 >> 3;
      if ((long)uVar7 < 0) {
        uVar9 = lVar8 >> 9;
LAB_0011b070:
        pdVar12 = pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar9] + uVar7 + uVar9 * -0x40;
      }
      else if (0x3f < uVar7) {
        uVar9 = uVar7 >> 6;
        goto LAB_0011b070;
      }
      (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar13][1]._vptr_Event =
           (_func_int **)(*pdVar12 * this->param->threshold);
      pPVar5 = (this->super_Synapse).to_population;
      (*pPVar5->_vptr_Population[5])(pPVar5,0);
      pdVar6 = (this->input).
               super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar12 = pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      lVar8 = (long)pdVar12 -
              (long)pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first;
      uVar7 = lVar8 >> 3;
      if ((long)uVar7 < 0) {
        uVar9 = lVar8 >> 9;
LAB_0011b0dc:
        pdVar12 = pdVar6[lVar13].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar9] + uVar7 + uVar9 * -0x40;
      }
      else if (0x3f < uVar7) {
        uVar9 = uVar7 >> 6;
        goto LAB_0011b0dc;
      }
      Logging::logValue(this->logger,(long)this,(int)lVar13,3,*pdVar12 * this->param->threshold);
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->inputSize);
  }
  return;
}

Assistant:

void BSA_SpikeDecodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        input[i].pop_front();
        input[i].push_back(0);
        if(from_population->output[i]->type == EventType::Spike) {
            for(int j = 0; j < param->filter_length; j++) {
                input[i][j] += filter[j];
            }
        }
        static_cast<ValueEvent*>(output[i])->setValue(input[i][0]*param->threshold);
        to_population->setInput(0, output[i]);
        logger->logValue((long)this, i, EventType::Value, input[i][0]*param->threshold);
    }
}